

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O2

int value_from_text(char *text,value_t *value,char type)

{
  int iVar1;
  char *pcVar2;
  size_t __size;
  uchar *__dest;
  undefined7 in_register_00000011;
  int stmp;
  uint utmp;
  
  iVar1 = (int)CONCAT71(in_register_00000011,type);
  value->type = iVar1;
  switch(iVar1) {
  case 0x62:
    iVar1 = __isoc99_sscanf(text,"%u",&utmp);
    if (iVar1 == 1) {
      stmp._0_1_ = (uchar)utmp;
      goto LAB_0011a41f;
    }
    goto LAB_0011a4b0;
  case 99:
    iVar1 = __isoc99_sscanf(text,"%d",&stmp);
    if (iVar1 != 1) goto LAB_0011a4b0;
LAB_0011a41f:
    (value->val).b = (uchar)stmp;
    return 1;
  case 100:
    pcVar2 = "%lf";
    break;
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
switchD_0011a3c1_caseD_65:
    fprintf(_stderr,"%s:value_from_text: invalid type \'%c\'\n",argv0);
    return 0;
  case 0x66:
    pcVar2 = "%f";
    break;
  case 0x6d:
    __size = strlen(text);
    __dest = (uchar *)malloc(__size);
    (value->val).m.data = __dest;
    memcpy(__dest,text,__size);
    (value->val).m.length = __size;
    return 1;
  default:
    if (iVar1 == 0x43) {
      iVar1 = __isoc99_sscanf(text,"#%02hhx%02hhx%02hhx%02hhx",&value->val,
                              (undefined1 *)((long)&value->val + 1),
                              (undefined1 *)((long)&value->val + 2),
                              (undefined1 *)((long)&value->val + 3));
      if (iVar1 == 4) {
        return 1;
      }
      goto LAB_0011a4b0;
    }
    if (iVar1 == 0x53) {
      pcVar2 = "%d";
    }
    else {
      if (iVar1 != 0x55) {
        if (iVar1 == 0x73) {
          iVar1 = __isoc99_sscanf(text,"%d",&stmp);
        }
        else {
          if (iVar1 != 0x75) {
            if (iVar1 == 0x7a) {
              pcVar2 = strdup(text);
              (value->val).z = pcVar2;
              return 1;
            }
            goto switchD_0011a3c1_caseD_65;
          }
          iVar1 = __isoc99_sscanf(text,"%u",&utmp);
          stmp._0_2_ = (uint16_t)utmp;
        }
        if (iVar1 == 1) {
          (value->val).u = (uint16_t)stmp;
          return 1;
        }
        goto LAB_0011a4b0;
      }
      pcVar2 = "%u";
    }
  }
  iVar1 = __isoc99_sscanf(text,pcVar2,&value->val);
  if (iVar1 == 1) {
    return 1;
  }
LAB_0011a4b0:
  fprintf(_stderr,"%s:value_from_text: couldn\'t parse \'%c\' from  \"%s\"\n",argv0,
          (ulong)(uint)value->type,text);
  return 0;
}

Assistant:

int
value_from_text(
    const char* text,
    value_t* value,
    char type)
{
#define READ(f, x) \
    if (sscanf(text, "%" #f, &x) != 1) { \
        fprintf(stderr, "%s:value_from_text: couldn't parse '%c' from  \"%s\"\n", argv0, value->type, text); \
        return 0; \
    }

    unsigned int utmp;
    int stmp;

    value->type = type;

    switch (value->type) {
    case 'f':
        READ(f, value->val.f);
        break;
    case 'd':
        READ(lf, value->val.d);
        break;
    case 'b':
        READ(u, utmp);
        value->val.b = utmp;
        break;
    case 'c':
        READ(d, stmp);
        value->val.c = stmp;
        break;
    case 'u':
        READ(u, utmp);
        value->val.u = utmp;
        break;
    case 's':
        READ(d, stmp);
        value->val.s = stmp;
        break;
    case 'U':
        READ(u, value->val.U);
        break;
    case 'S':
        READ(d, value->val.S);
        break;
    case 'C':
        if (sscanf(text, "#%02hhx%02hhx%02hhx%02hhx", &value->val.C[0], &value->val.C[1], &value->val.C[2], &value->val.C[3]) != 4) {
            fprintf(stderr, "%s:value_from_text: couldn't parse '%c' from  \"%s\"\n", argv0, value->type, text);
            return 0;
        }
        break;
    case 'z':
        value->val.z = strdup(text);
        break;
    case 'm': {
        size_t zlen = strlen(text);
        value->val.m.data = malloc(zlen);
        memcpy(value->val.m.data, text, zlen);
        value->val.m.length = zlen;
        break;
    }
    default:
        fprintf(stderr, "%s:value_from_text: invalid type '%c'\n", argv0, value->type);
        return 0;
    }

    return 1;

#undef READ
}